

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FragmentOutExecutor::addAttribute
          (FragmentOutExecutor *this,deUint32 bindingLocation,VkFormat format,
          deUint32 sizePerElement,deUint32 count,void *dataPtr)

{
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  VkResult result;
  size_type sVar1;
  VkDevice device;
  DeviceInterface *vk_00;
  Allocator *pAVar2;
  Handle<(vk::HandleType)8> *pHVar3;
  Allocation *pAVar4;
  VkDeviceSize VVar5;
  void *dst;
  Unique<vk::Handle<(vk::HandleType)8>_> *this_00;
  SharedPtr<vk::Allocation> local_160;
  RefData<vk::Handle<(vk::HandleType)8>_> local_150;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_130;
  VkDeviceMemory local_120;
  deUint64 local_118;
  deUint64 local_110;
  uint local_104;
  deUint64 local_100;
  VkMemoryRequirements local_f8;
  undefined1 local_d0 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkBufferCreateInfo vertexBufferParams;
  VkDeviceSize inputSize;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  VkVertexInputAttributeDescription attributeDescription;
  VkVertexInputBindingDescription bindingDescription;
  deUint32 binding;
  void *dataPtr_local;
  deUint32 count_local;
  deUint32 sizePerElement_local;
  VkFormat format_local;
  deUint32 bindingLocation_local;
  FragmentOutExecutor *this_local;
  
  sVar1 = std::
          vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
          ::size(&this->m_vertexBindingDescriptions);
  attributeDescription.format = (VkFormat)sVar1;
  attributeDescription.offset = sizePerElement;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::push_back(&this->m_vertexBindingDescriptions,(value_type *)&attributeDescription.format);
  attributeDescription.binding = 0;
  vkDevice._0_4_ = bindingLocation;
  vkDevice._4_4_ = (VkFormat)sVar1;
  attributeDescription.location = format;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(&this->m_vertexAttributeDescriptions,(value_type *)&vkDevice);
  device = Context::getDevice((this->super_ShaderExecutor).m_context);
  vk_00 = Context::getDeviceInterface((this->super_ShaderExecutor).m_context);
  Context::getUniversalQueueFamilyIndex((this->super_ShaderExecutor).m_context);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ = 0xc;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                     &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                      m_data.field_0x8,vk_00,device,
                     (VkBufferCreateInfo *)
                     &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,(VkAllocationCallbacks *)0x0);
  pAVar2 = Context::getDefaultAllocator((this->super_ShaderExecutor).m_context);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                       m_data.field_0x8);
  local_100 = pHVar3->m_internal;
  ::vk::getBufferMemoryRequirements(&local_f8,vk_00,device,(VkBuffer)local_100);
  local_104 = ::vk::MemoryRequirement::HostVisible;
  (*pAVar2->_vptr_Allocator[3])
            (local_d0,pAVar2,&local_f8,(ulong)::vk::MemoryRequirement::HostVisible);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                       m_data.field_0x8);
  local_110 = pHVar3->m_internal;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  local_118 = (deUint64)::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  VVar5 = ::vk::Allocation::getOffset(pAVar4);
  result = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,local_110,local_118,VVar5);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                    ,0x275);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  dst = ::vk::Allocation::getHostPtr(pAVar4);
  ::deMemcpy(dst,dataPtr,(ulong)(sizePerElement * count));
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  local_120 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  VVar5 = ::vk::Allocation::getOffset(pAVar4);
  ::vk::flushMappedMemoryRange(vk_00,device,local_120,VVar5,(ulong)(sizePerElement * count));
  this_00 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_150,
             (Move *)&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                      m_data.field_0x8);
  data.deleter.m_deviceIface = local_150.deleter.m_deviceIface;
  data.object.m_internal = local_150.object.m_internal;
  data.deleter.m_device = local_150.deleter.m_device;
  data.deleter.m_allocator = local_150.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(this_00,data);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
            (&local_130,this_00);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::push_back(&this->m_vertexBuffers,&local_130);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_130);
  pAVar4 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                     ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  de::SharedPtr<vk::Allocation>::SharedPtr(&local_160,pAVar4);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  push_back(&this->m_vertexBufferAllocs,&local_160);
  de::SharedPtr<vk::Allocation>::~SharedPtr(&local_160);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_d0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
              field_0x8);
  return;
}

Assistant:

void FragmentOutExecutor::addAttribute (deUint32 bindingLocation, VkFormat format, deUint32 sizePerElement, deUint32 count, const void* dataPtr)
{
	// Add binding specification
	const deUint32							binding = (deUint32)m_vertexBindingDescriptions.size();
	const VkVertexInputBindingDescription	bindingDescription =
	{
		binding,
		sizePerElement,
		VK_VERTEX_INPUT_RATE_VERTEX
	};

	m_vertexBindingDescriptions.push_back(bindingDescription);

	// Add location and format specification
	const VkVertexInputAttributeDescription attributeDescription =
	{
		bindingLocation,			// deUint32	location;
		binding,					// deUint32	binding;
		format,						// VkFormat	format;
		0u,							// deUint32	offsetInBytes;
	};

	m_vertexAttributeDescriptions.push_back(attributeDescription);

	// Upload data to buffer
	const VkDevice				vkDevice			= m_context.getDevice();
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize			inputSize			= sizePerElement * count;
	const VkBufferCreateInfo	vertexBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		inputSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyCount;
		&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>			buffer	= createBuffer(vk, vkDevice, &vertexBufferParams);
	de::MovePtr<Allocation>	alloc	= m_context.getDefaultAllocator().allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);

	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset()));

	deMemcpy(alloc->getHostPtr(), dataPtr, (size_t)inputSize);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), inputSize);

	m_vertexBuffers.push_back(de::SharedPtr<Unique<VkBuffer> >(new Unique<VkBuffer>(buffer)));
	m_vertexBufferAllocs.push_back(AllocationSp(alloc.release()));
}